

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O1

void __thiscall
optimization::common_expr_del::BlockNodes::add_var(BlockNodes *this,VarId *var,NodeId nodeId)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined8 uVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _List_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  bool bVar10;
  
  pmVar5 = std::
           map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
           ::operator[](&this->var_map,var);
  pmVar5->id = nodeId.id;
  uVar1 = var->id;
  peVar2 = (((this->blv->
             super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->live_vars_out).
           super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var9 = &(peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var6 = p_Var9;
  for (p_Var8 = *(_Base_ptr *)((long)&(peVar2->_M_t)._M_impl.super__Rb_tree_header + 8);
      p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[bVar10]) {
    bVar10 = *(uint *)&p_Var8[1]._M_parent < uVar1;
    if (!bVar10) {
      p_Var6 = p_Var8;
    }
  }
  p_Var8 = p_Var9;
  if ((p_Var6 != p_Var9) && (p_Var8 = p_Var6, uVar1 < *(uint *)&p_Var6[1]._M_parent)) {
    p_Var8 = p_Var9;
  }
  peVar3 = (this->nodes).
           super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start[nodeId.id].
           super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var7 = (_List_node_base *)operator_new(0x20);
  p_Var7[1]._M_next = (_List_node_base *)&PTR_display_001ee058;
  *(uint *)&p_Var7[1]._M_prev = uVar1;
  uVar4 = &peVar3->local_vars;
  if (p_Var8 != p_Var9) {
    uVar4 = &peVar3->live_vars;
  }
  std::__detail::_List_node_base::_M_hook(p_Var7);
  *(size_t *)(uVar4 + 0x10) = *(size_t *)(uVar4 + 0x10) + 1;
  return;
}

Assistant:

void add_var(mir::inst::VarId var, NodeId nodeId) {
    var_map[var] = nodeId;
    if (in_live_out(var)) {
      nodes[nodeId.id]->add_live_var(var);
    } else {
      nodes[nodeId.id]->add_local_var(var);
    }
  }